

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall cmFileAPI::BuildReply(Value *__return_storage_ptr__,cmFileAPI *this,Query *q)

{
  cmFileAPI *pcVar1;
  pointer pbVar2;
  Value *pVVar3;
  Value *this_00;
  Object *extraout_RDX;
  Object *o_00;
  Object *extraout_RDX_00;
  Object *o;
  cmFileAPI *this_01;
  pointer key;
  allocator<char> local_81;
  Query *local_80;
  Value local_78;
  string local_50;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  pcVar1 = (cmFileAPI *)
           (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  o_00 = extraout_RDX;
  local_80 = q;
  for (this_01 = (cmFileAPI *)
                 (q->Known).
                 super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pcVar1;
      this_01 = (cmFileAPI *)&(this_01->APIv1)._M_string_length) {
    ObjectName_abi_cxx11_((string *)&local_78,this_01,o_00);
    pVVar3 = AddReplyIndexObject(this,(Object *)this_01);
    this_00 = Json::Value::operator[](__return_storage_ptr__,(String *)&local_78);
    Json::Value::operator=(this_00,pVVar3);
    std::__cxx11::string::~string((string *)&local_78);
    o_00 = extraout_RDX_00;
  }
  pbVar2 = (local_80->Unknown).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (key = (local_80->Unknown).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; key != pbVar2; key = key + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"unknown query file",&local_81);
    BuildReplyError(&local_78,&local_50);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,key);
    Json::Value::operator=(pVVar3,&local_78);
    Json::Value::~Value(&local_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReply(Query const& q)
{
  Json::Value reply = Json::objectValue;
  for (Object const& o : q.Known) {
    std::string const& name = ObjectName(o);
    reply[name] = this->AddReplyIndexObject(o);
  }

  for (std::string const& name : q.Unknown) {
    reply[name] = cmFileAPI::BuildReplyError("unknown query file");
  }
  return reply;
}